

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

void __thiscall
spvtools::opt::VectorDCE::AddItemToWorkListIfNeeded
          (VectorDCE *this,WorkListItem *work_item,LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  Instruction *this_00;
  bool bVar1;
  iterator iVar2;
  uint32_t local_40 [2];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  this_00 = work_item->instruction;
  local_40[0] = Instruction::result_id(this_00);
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&live_components->_M_h,local_40);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false>.
      _M_cur == (__node_type *)0x0) {
    local_40[0] = Instruction::result_id(this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
               &(work_item->components).bits_);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int,spvtools::utils::BitVector>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)live_components,local_40);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  }
  else {
    bVar1 = utils::BitVector::Or
                      ((BitVector *)
                       ((long)iVar2.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false>
                              ._M_cur + 0x10),&work_item->components);
    if (!bVar1) {
      return;
    }
  }
  std::
  vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>
  ::emplace_back<spvtools::opt::VectorDCE::WorkListItem&>
            ((vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>
              *)work_list,work_item);
  return;
}

Assistant:

void VectorDCE::AddItemToWorkListIfNeeded(
    WorkListItem work_item, VectorDCE::LiveComponentMap* live_components,
    std::vector<WorkListItem>* work_list) {
  Instruction* current_inst = work_item.instruction;
  auto it = live_components->find(current_inst->result_id());
  if (it == live_components->end()) {
    live_components->emplace(
        std::make_pair(current_inst->result_id(), work_item.components));
    work_list->emplace_back(work_item);
  } else {
    if (it->second.Or(work_item.components)) {
      work_list->emplace_back(work_item);
    }
  }
}